

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
baseObject::drawObject
          (baseObject *this,ostream *os,uint counter,size *_canvasOffset,size *_canvasSize)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  objectType oVar5;
  pointer pbVar6;
  char cVar7;
  int iVar8;
  ostream *poVar9;
  pointer p_Var10;
  pointer p_Var11;
  pointer p_Var12;
  int iVar13;
  size_t index;
  long lVar14;
  char *pcVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  bezierPoint *it;
  pointer pbVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double ratioY;
  
  iVar16 = (int)(_canvasOffset->width * 360000.0);
  iVar18 = (int)(_canvasOffset->height * 360000.0);
  dVar1 = _canvasSize->width;
  dVar2 = _canvasSize->height;
  iVar13 = (int)(dVar1 * 360000.0);
  iVar8 = (int)(dVar2 * 360000.0);
  oVar5 = this->type;
  if (oVar5 != OBJECT_CLOSEDLINE) {
    if (oVar5 == OBJECT_STRAIGHTLINE) {
      p_Var11 = (this->points).super__Vector_base<_point,_std::allocator<_point>_>._M_impl.
                super__Vector_impl_data._M_start;
      dVar3 = p_Var11[1].x;
      p_Var10 = p_Var11 + 1;
      if (p_Var11->y < p_Var11[1].y) {
        p_Var10 = p_Var11;
      }
      dVar21 = p_Var11->x;
      dVar24 = dVar21;
      if (dVar3 <= dVar21) {
        dVar24 = dVar3;
      }
      p_Var12 = p_Var11 + 1;
      if (p_Var11[1].y < p_Var11->y) {
        p_Var12 = p_Var11;
      }
      if (dVar21 <= dVar3) {
        dVar21 = dVar3;
      }
      dVar3 = p_Var12->y;
      dVar4 = (this->rangeX).min;
      dVar25 = (this->rangeX).max - dVar4;
      dVar20 = (this->rangeY).min;
      dVar22 = (this->rangeY).max - dVar20;
      dVar23 = p_Var10->y;
      std::__ostream_insert<char,std::char_traits<char>>
                (os,"<p:cxnSp><p:nvCxnSpPr><p:cNvPr id=\"",0x23);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" name=\"LineArrow",0x11);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,
                 "\"><a:extLst><a:ext uri=\"{FF2B5EF4-FFF2-40B4-BE49-F238E27FC236}\"><a16:creationId xmlns:a16=\"http://schemas.microsoft.com/office/drawing/2014/main\" id=\"{B606E735-2B9E-47D5-A972-698E782DD359}\"/></a:ext></a:extLst></p:cNvPr><p:cNvCxnSpPr/><p:nvPr/></p:nvCxnSpPr>"
                 ,0x102);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,"<p:spPr><a:xfrm flipV=\"1\"><a:off x=\"",0x24);
      poVar9 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)os,(int)((dVar24 - dVar4) * ((double)iVar13 / dVar25)) + iVar16
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" y=\"",5);
      poVar9 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar9,
                          (int)((double)iVar8 - (dVar3 - dVar20) * ((double)iVar8 / dVar22)) +
                          iVar18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"/><a:ext cx=\"",0xe);
      poVar9 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar9,(int)(dVar1 * ((dVar21 - dVar24) / dVar25) * 360000.0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" cy=\"",6);
      os = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar9,(int)(dVar2 * ((dVar3 - dVar23) / dVar22) * 360000.0));
      pcVar15 = 
      "\"/></a:xfrm><a:prstGeom prst=\"straightConnector1\"><a:avLst/></a:prstGeom><a:ln><a:tailEnd type=\"triangle\"/></a:ln></p:spPr><p:style><a:lnRef idx=\"1\"><a:schemeClr val=\"accent1\"/></a:lnRef><a:fillRef idx=\"0\"><a:schemeClr val=\"accent1\"/></a:fillRef><a:effectRef idx=\"0\"><a:schemeClr val=\"accent1\"/></a:effectRef><a:fontRef idx=\"minor\"><a:schemeClr val=\"tx1\"/></a:fontRef></p:style></p:cxnSp>"
      ;
      lVar14 = 0x184;
      goto LAB_001044cb;
    }
    if (oVar5 != OBJECT_CURVES) {
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"<p:sp><p:nvSpPr><p:cNvPr id=\"",0x1d);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,
             "\" name=\"qqqqqqqqq\"><a:extLst><a:ext uri=\"{FF2B5EF4-FFF2-40B4-BE49-F238E27FC236}\"><a16:creationId xmlns:a16=\"http://schemas.microsoft.com/office/drawing/2014/main\" id=\"{29FFCF3D-8F32-482F-B193-ACC1CF50B0FA}\"/></a:ext></a:extLst></p:cNvPr><p:cNvSpPr/><p:nvPr/></p:nvSpPr>"
             ,0x10d);
  std::__ostream_insert<char,std::char_traits<char>>(os,"<p:spPr><a:xfrm><a:off x=\"",0x1a);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)os,iVar16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" y=\"",5);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"/>",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<a:ext cx=\"",0xb);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)os,iVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" cy=\"",6);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"/>",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  poVar9 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"</a:xfrm><a:custGeom><a:avLst/><a:gdLst>",0x28);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  p_Var11 = (this->points).super__Vector_base<_point,_std::allocator<_point>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->points).super__Vector_base<_point,_std::allocator<_point>_>._M_impl.
      super__Vector_impl_data._M_finish != p_Var11) {
    lVar14 = 8;
    uVar17 = 0;
    do {
      dVar1 = (this->rangeX).min;
      dVar2 = (this->rangeX).max;
      dVar3 = (this->rangeY).max;
      dVar21 = (this->rangeY).min;
      dVar24 = *(double *)((long)p_Var11 + lVar14 + -8);
      dVar4 = *(double *)((long)&p_Var11->x + lVar14);
      std::__ostream_insert<char,std::char_traits<char>>(os,"<a:gd name=\"connsiteX",0x15);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"  fmla=\"*/ ",0xc);
      poVar9 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar9,
                          (int)((dVar24 - dVar1) * ((double)iVar13 / (dVar2 - dVar1))));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," w ",3);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"/>",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(os,"<a:gd name=\"connsiteY",0x15);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"  fmla=\"*/ ",0xc);
      poVar9 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar9,
                          (int)((double)iVar8 -
                               (dVar4 - dVar21) * ((double)iVar8 / (dVar3 - dVar21))));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," h ",3);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"/>",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      uVar17 = uVar17 + 1;
      p_Var11 = (this->points).super__Vector_base<_point,_std::allocator<_point>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar14 = lVar14 + 0x10;
    } while (uVar17 < (ulong)((long)(this->points).
                                    super__Vector_base<_point,_std::allocator<_point>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)p_Var11 >> 4));
  }
  if (this->type == OBJECT_CLOSEDLINE) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"<a:gd name=\"connsiteX",0x15);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"  fmla=\"*/ ",0xc);
    poVar9 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar9,
                        (int)((this->points).super__Vector_base<_point,_std::allocator<_point>_>.
                              _M_impl.super__Vector_impl_data._M_start)->x);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," w ",3);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"/>",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(os,"<a:gd name=\"connsiteY",0x15);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"  fmla=\"*/ ",0xc);
    poVar9 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar9,
                        (int)((this->points).super__Vector_base<_point,_std::allocator<_point>_>.
                              _M_impl.super__Vector_impl_data._M_start)->y);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," h ",3);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"/>",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"</a:gdLst><a:ahLst/><a:cxnLst>",0x1e);
  cVar7 = (char)os;
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  p_Var11 = (this->points).super__Vector_base<_point,_std::allocator<_point>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->points).super__Vector_base<_point,_std::allocator<_point>_>._M_impl.
      super__Vector_impl_data._M_finish != p_Var11) {
    uVar17 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os,"<a:cxn ang=\"0\">",0xf);
      std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(os,"<a:pos x=\"connsiteX",0x13);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" y=\"connsiteY",0xe);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"/>",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(os,"</a:cxn>",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
      uVar17 = uVar17 + 1;
      p_Var11 = (this->points).super__Vector_base<_point,_std::allocator<_point>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar17 < (ulong)((long)(this->points).
                                    super__Vector_base<_point,_std::allocator<_point>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)p_Var11 >> 4));
  }
  if (this->type == OBJECT_CLOSEDLINE) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"<a:cxn ang=\"0\">",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar7);
    std::ostream::put(cVar7);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(os,"<a:pos x=\"connsiteX",0x13);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" y=\"connsiteY",0xe);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"/>",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(os,"</a:cxn>",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar7);
    std::ostream::put(cVar7);
    std::ostream::flush();
    p_Var11 = (this->points).super__Vector_base<_point,_std::allocator<_point>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  dVar20 = (double)iVar13;
  dVar23 = (double)iVar8;
  dVar1 = (this->rangeX).min;
  dVar2 = (this->rangeX).max;
  dVar3 = (this->rangeY).max;
  dVar21 = (this->rangeY).min;
  dVar24 = p_Var11->x;
  dVar4 = p_Var11->y;
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"</a:cxnLst><a:rect l=\"l\" t=\"t\" r=\"r\" b=\"b\"/><a:pathLst>",0x37);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<a:path w=\"",0xb);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)os,iVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" h=\"",5);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\">",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<a:moveTo>",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<a:pt x=\"",9);
  poVar9 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)os,(int)((dVar24 - dVar1) * (dVar20 / (dVar2 - dVar1))));
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" y=\"",5);
  poVar9 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar9,
                      (int)(dVar23 - (dVar4 - dVar21) * (dVar23 / (dVar3 - dVar21))));
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"/>",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"</a:moveTo>",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  pbVar6 = (this->curves).super__Vector_base<bezierPoint,_std::allocator<bezierPoint>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pbVar19 = (this->curves).super__Vector_base<bezierPoint,_std::allocator<bezierPoint>_>.
                 _M_impl.super__Vector_impl_data._M_start; pbVar19 != pbVar6; pbVar19 = pbVar19 + 1)
  {
    std::__ostream_insert<char,std::char_traits<char>>(os,"<a:cubicBezTo>",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar7);
    std::ostream::put(cVar7);
    std::ostream::flush();
    lVar14 = 8;
    do {
      dVar1 = (this->rangeX).min;
      dVar2 = (this->rangeX).max;
      dVar3 = (this->rangeY).max;
      dVar21 = (this->rangeY).min;
      dVar24 = *(double *)((long)pbVar19->pt + lVar14 + -8);
      dVar4 = *(double *)((long)&pbVar19->pt[0].x + lVar14);
      std::__ostream_insert<char,std::char_traits<char>>(os,"<a:pt x=\"",9);
      poVar9 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)os,(int)((dVar24 - dVar1) * (dVar20 / (dVar2 - dVar1))));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" y=\"",5);
      poVar9 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar9,
                          (int)(dVar23 - (dVar4 - dVar21) * (dVar23 / (dVar3 - dVar21))));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"/>",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x38);
    std::__ostream_insert<char,std::char_traits<char>>(os,"</a:cubicBezTo>",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar7);
    std::ostream::put(cVar7);
    std::ostream::flush();
  }
  if (this->type == OBJECT_CLOSEDLINE) {
    p_Var11 = (this->points).super__Vector_base<_point,_std::allocator<_point>_>._M_impl.
              super__Vector_impl_data._M_start;
    dVar1 = (this->rangeX).min;
    dVar2 = (this->rangeX).max;
    dVar3 = (this->rangeY).max;
    dVar21 = (this->rangeY).min;
    dVar24 = p_Var11->x;
    dVar4 = p_Var11->y;
    std::__ostream_insert<char,std::char_traits<char>>(os,"<a:lnTo>",8);
    std::__ostream_insert<char,std::char_traits<char>>(os,"<a:pt x=\"",9);
    iVar8 = (int)((dVar24 - dVar1) * (dVar20 / (dVar2 - dVar1)));
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)os,iVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" y=\"",5);
    iVar13 = (int)(dVar23 - (dVar4 - dVar21) * (dVar23 / (dVar3 - dVar21)));
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"/>",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"</a:lnTo>",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"<a:lnTo>",8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"<a:pt x=\"",9);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" y=\"",5);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"/>",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"</a:lnTo>",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"<a:close/>",10);
    std::__ostream_insert<char,std::char_traits<char>>(os,"</a:path>",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar7);
    std::ostream::put(cVar7);
    poVar9 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"</a:pathLst>",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    poVar9 = (ostream *)std::ostream::flush();
    pcVar15 = "</a:custGeom><a:solidFill><a:schemeClr val=\"accent1\"/></a:solidFill></p:spPr>";
    lVar14 = 0x4d;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"</a:path>",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar7);
    std::ostream::put(cVar7);
    poVar9 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"</a:pathLst>",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    poVar9 = (ostream *)std::ostream::flush();
    pcVar15 = "</a:custGeom><a:noFill/></p:spPr>";
    lVar14 = 0x21;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar15,lVar14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  pcVar15 = 
  "<p:style><a:lnRef idx=\"2\"><a:schemeClr val=\"accent1\"><a:shade val=\"50000\"/></a:schemeClr></a:lnRef><a:fillRef idx=\"1\"><a:schemeClr val=\"accent1\"/></a:fillRef><a:effectRef idx=\"0\"><a:schemeClr val=\"accent1\"/></a:effectRef><a:fontRef idx=\"minor\"><a:schemeClr val=\"lt1\"/></a:fontRef></p:style><p:txBody><a:bodyPr rtlCol=\"0\" anchor=\"ctr\"/><a:lstStyle/><a:p><a:pPr algn=\"ctr\"/><a:endParaRPr kumimoji=\"1\" lang=\"ja-JP\" altLang=\"en-US\"/></a:p></p:txBody></p:sp>"
  ;
  lVar14 = 0x1c5;
LAB_001044cb:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar15,lVar14);
  return;
}

Assistant:

void drawObject(std::ostream& os, unsigned int counter, const size& _canvasOffset, const size& _canvasSize) const
    {
        int canvasOffsetPPTXWidth = (int)(_canvasOffset.width * cm2pptx);
        int canvasOffsetPPTXHeight = (int)(_canvasOffset.height * cm2pptx);
        int canvasSizePPTXWidth = (int)(_canvasSize.width * cm2pptx);
        int canvasSizePPTXHeight = (int)(_canvasSize.height * cm2pptx);
        switch (type)
        {
        case OBJECT_CLOSEDLINE:
        case OBJECT_CURVES:
        {
            os << "<p:sp><p:nvSpPr><p:cNvPr id=\"" << counter << "\" name=\"qqqqqqqqq\"><a:extLst><a:ext uri=\"{FF2B5EF4-FFF2-40B4-BE49-F238E27FC236}\"><a16:creationId xmlns:a16=\"http://schemas.microsoft.com/office/drawing/2014/main\" id=\"{29FFCF3D-8F32-482F-B193-ACC1CF50B0FA}\"/></a:ext></a:extLst></p:cNvPr><p:cNvSpPr/><p:nvPr/></p:nvSpPr>";
            os << "<p:spPr><a:xfrm><a:off x=\"" << canvasOffsetPPTXWidth << "\" y=\"" << canvasOffsetPPTXHeight << "\"/>" << std::endl;
            os << "<a:ext cx=\"" << canvasSizePPTXWidth << "\" cy=\"" << canvasSizePPTXHeight << "\"/>" << std::endl << "</a:xfrm><a:custGeom><a:avLst/><a:gdLst>" << std::endl;
            for (size_t i = 0; i < points.size(); i++)
            {
                point canvasPoint = convertToCanvas(points[i], size(canvasSizePPTXWidth, canvasSizePPTXHeight));
                os << "<a:gd name=\"connsiteX" << i << "\"  fmla=\"*/ " << (int)(canvasPoint.x) << " w " << canvasSizePPTXWidth << "\"/>" << std::endl;
                os << "<a:gd name=\"connsiteY" << i << "\"  fmla=\"*/ " << (int)(canvasPoint.y) << " h " << canvasSizePPTXHeight << "\"/>" << std::endl;
            }
            if (type == OBJECT_CLOSEDLINE)
            {
                size_t index = points.size();
                os << "<a:gd name=\"connsiteX" << index << "\"  fmla=\"*/ " << (int)(points[0].x) << " w " << canvasSizePPTXWidth << "\"/>" << std::endl;
                os << "<a:gd name=\"connsiteY" << index << "\"  fmla=\"*/ " << (int)(points[0].y) << " h " << canvasSizePPTXHeight << "\"/>" << std::endl;
            }
            os << "</a:gdLst><a:ahLst/><a:cxnLst>" << std::endl;
            for (size_t i = 0; i < points.size(); i++)
            {
                os << "<a:cxn ang=\"0\">" << std::endl;
                os << "<a:pos x=\"connsiteX" << i << "\" y=\"connsiteY" << i << "\"/>" << std::endl;
                os << "</a:cxn>" << std::endl;
            }
            if (type == OBJECT_CLOSEDLINE)
            {
                size_t index = points.size();
                os << "<a:cxn ang=\"0\">" << std::endl;
                os << "<a:pos x=\"connsiteX" << index << "\" y=\"connsiteY" << index << "\"/>" << std::endl;
                os << "</a:cxn>" << std::endl;
            }
            {
                point canvasPointStart = convertToCanvas(points[0], size(canvasSizePPTXWidth, canvasSizePPTXHeight));
                os << "</a:cxnLst><a:rect l=\"l\" t=\"t\" r=\"r\" b=\"b\"/><a:pathLst>" << std::endl;
                os << "<a:path w=\"" << canvasSizePPTXWidth << "\" h=\"" << canvasSizePPTXHeight << "\">" << std::endl;
                os << "<a:moveTo>" << std::endl;
                os << "<a:pt x=\"" << (int)(canvasPointStart.x) << "\" y=\"" << (int)(canvasPointStart.y) << "\"/>" << std::endl;
                os << "</a:moveTo>" << std::endl;
            }
            for (auto&& it : curves)
            {
                os << "<a:cubicBezTo>" << std::endl;
                for (size_t i = 0; i < 3; i++)
                {
                    point canvasPoint = convertToCanvas(it.pt[i], size(canvasSizePPTXWidth, canvasSizePPTXHeight));
                    os << "<a:pt x=\"" << (int)(canvasPoint.x) << "\" y=\"" << (int)(canvasPoint.y) << "\"/>" << std::endl;
                }
                os << "</a:cubicBezTo>" << std::endl;
            }
            if (type == OBJECT_CLOSEDLINE)
            {
                point canvasPoint = convertToCanvas(points[0], size(canvasSizePPTXWidth, canvasSizePPTXHeight));
                os << "<a:lnTo>"
                    << "<a:pt x=\"" << (int)(canvasPoint.x) << "\" y=\"" << (int)(canvasPoint.y) << "\"/>"
                    << "</a:lnTo>"
                    << "<a:lnTo>"
                    << "<a:pt x=\"" << (int)(canvasPoint.x) << "\" y=\"" << (int)(canvasPoint.y) << "\"/>"
                    << "</a:lnTo>"
                    << "<a:close/>";
                os << "</a:path>" << std::endl << "</a:pathLst>" << std::endl << "</a:custGeom><a:solidFill><a:schemeClr val=\"accent1\"/></a:solidFill></p:spPr>" << std::endl;

            }
            else
            {
                os << "</a:path>" << std::endl << "</a:pathLst>" << std::endl << "</a:custGeom><a:noFill/></p:spPr>" << std::endl;
            }
            os << "<p:style><a:lnRef idx=\"2\"><a:schemeClr val=\"accent1\"><a:shade val=\"50000\"/></a:schemeClr></a:lnRef><a:fillRef idx=\"1\"><a:schemeClr val=\"accent1\"/></a:fillRef><a:effectRef idx=\"0\"><a:schemeClr val=\"accent1\"/></a:effectRef><a:fontRef idx=\"minor\"><a:schemeClr val=\"lt1\"/></a:fontRef></p:style><p:txBody><a:bodyPr rtlCol=\"0\" anchor=\"ctr\"/><a:lstStyle/><a:p><a:pPr algn=\"ctr\"/><a:endParaRPr kumimoji=\"1\" lang=\"ja-JP\" altLang=\"en-US\"/></a:p></p:txBody></p:sp>";
        }
        break;
        case OBJECT_STRAIGHTLINE:
        {
            double minX = points[0].x < points[1].x ? points[0].x : points[1].x;
            double maxX = points[1].x < points[0].x ? points[0].x : points[1].x;
            double minY = points[0].y < points[1].y ? points[0].y : points[1].y;
            double maxY = points[1].y < points[0].y ? points[0].y : points[1].y;
            point LB = convertToCanvas(point(minX, minY), size(canvasSizePPTXWidth, canvasSizePPTXHeight));
            point RT = convertToCanvas(point(maxX, maxY), size(canvasSizePPTXWidth, canvasSizePPTXHeight));
            int offsetX = (int)(LB.x) + canvasOffsetPPTXWidth;
            int offsetY = (int)(RT.y) + canvasOffsetPPTXHeight;
            int canvasWidth = (int)(((maxX - minX) / (rangeX.max - rangeX.min)) * cm2pptx * _canvasSize.width);
            int canvasHeight = (int)(((maxY - minY) / (rangeY.max - rangeY.min)) * cm2pptx * _canvasSize.height);

            os << "<p:cxnSp><p:nvCxnSpPr><p:cNvPr id=\"" << counter << "\" name=\"LineArrow" << counter << "\"><a:extLst><a:ext uri=\"{FF2B5EF4-FFF2-40B4-BE49-F238E27FC236}\"><a16:creationId xmlns:a16=\"http://schemas.microsoft.com/office/drawing/2014/main\" id=\"{B606E735-2B9E-47D5-A972-698E782DD359}\"/></a:ext></a:extLst></p:cNvPr><p:cNvCxnSpPr/><p:nvPr/></p:nvCxnSpPr>";
            os << "<p:spPr><a:xfrm flipV=\"1\"><a:off x=\"" << offsetX << "\" y=\"" << offsetY << "\"/><a:ext cx=\"" << canvasWidth << "\" cy=\"" << canvasHeight << "\"/></a:xfrm><a:prstGeom prst=\"straightConnector1\"><a:avLst/></a:prstGeom><a:ln><a:tailEnd type=\"triangle\"/></a:ln></p:spPr><p:style><a:lnRef idx=\"1\"><a:schemeClr val=\"accent1\"/></a:lnRef><a:fillRef idx=\"0\"><a:schemeClr val=\"accent1\"/></a:fillRef><a:effectRef idx=\"0\"><a:schemeClr val=\"accent1\"/></a:effectRef><a:fontRef idx=\"minor\"><a:schemeClr val=\"tx1\"/></a:fontRef></p:style></p:cxnSp>";
        }
        break;
        default:
            break;
        }
    }